

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

uint __thiscall ON_String::UnsignedLength(ON_String *this)

{
  ON_Internal_Empty_aString *pOVar1;
  
  pOVar1 = &empty_astring;
  if (this->m_s != (char *)0x0) {
    pOVar1 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
  }
  return (pOVar1->header).string_length;
}

Assistant:

ON_aStringHeader* ON_String::Header() const
{
  ON_aStringHeader* hdr = (ON_aStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_astring.header;
  return hdr;
}